

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_parse_login_details
                   (char *login,size_t len,char **userp,char **passwdp,char **optionsp)

{
  CURLcode CVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  size_t length;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  
  pcVar2 = (char *)memchr(login,0x3a,len);
  if (optionsp == (char **)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)memchr(login,0x3b,len);
  }
  if (pcVar2 == (char *)0x0) {
    length = (long)pcVar3 - (long)login;
    if (pcVar3 == (char *)0x0) {
      length = len;
    }
  }
  else {
    pcVar7 = pcVar2;
    if (pcVar3 < pcVar2 && pcVar3 != (char *)0x0) {
      pcVar7 = pcVar3;
    }
    length = (long)pcVar7 - (long)login;
  }
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = login + len;
    if (pcVar2 < pcVar3) {
      pcVar7 = pcVar3;
    }
    if (pcVar3 == (char *)0x0) {
      pcVar7 = login + len;
    }
    pcVar7 = pcVar7 + ~(ulong)pcVar2;
  }
  if (pcVar3 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = login + len;
    if (pcVar3 < pcVar2) {
      pcVar5 = pcVar2;
    }
    if (pcVar2 == (char *)0x0) {
      pcVar5 = login + len;
    }
    pcVar5 = pcVar5 + ~(ulong)pcVar3;
  }
  pcVar4 = (char *)Curl_memdup0(login,length);
  if (pcVar4 == (char *)0x0) {
LAB_001603ef:
    pcVar2 = (char *)0x0;
LAB_001603f2:
    (*Curl_cfree)(pcVar4);
    (*Curl_cfree)(pcVar2);
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    if (pcVar2 == (char *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = (char *)Curl_memdup0(pcVar2 + 1,(size_t)pcVar7);
      if (pcVar2 == (char *)0x0) goto LAB_001603ef;
    }
    if (optionsp != (char **)0x0) {
      iVar6 = 0;
      if (pcVar5 == (char *)0x0) {
        pcVar3 = (char *)0x0;
LAB_0016043d:
        *optionsp = pcVar3;
      }
      else {
        pcVar3 = (char *)Curl_memdup0(pcVar3 + 1,(size_t)pcVar5);
        if (pcVar3 != (char *)0x0) goto LAB_0016043d;
        iVar6 = 6;
      }
      if (iVar6 == 6) goto LAB_001603f2;
      if (iVar6 != 0) {
        return (CURLcode)pcVar3;
      }
    }
    *userp = pcVar4;
    *passwdp = pcVar2;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_parse_login_details(const char *login, const size_t len,
                                  char **userp, char **passwdp,
                                  char **optionsp)
{
  char *ubuf = NULL;
  char *pbuf = NULL;
  const char *psep = NULL;
  const char *osep = NULL;
  size_t ulen;
  size_t plen;
  size_t olen;

  DEBUGASSERT(userp);
  DEBUGASSERT(passwdp);

  /* Attempt to find the password separator */
  psep = memchr(login, ':', len);

  /* Attempt to find the options separator */
  if(optionsp)
    osep = memchr(login, ';', len);

  /* Calculate the portion lengths */
  ulen = (psep ?
          (size_t)(osep && psep > osep ? osep - login : psep - login) :
          (osep ? (size_t)(osep - login) : len));
  plen = (psep ?
          (osep && osep > psep ? (size_t)(osep - psep) :
           (size_t)(login + len - psep)) - 1 : 0);
  olen = (osep ?
          (psep && psep > osep ? (size_t)(psep - osep) :
           (size_t)(login + len - osep)) - 1 : 0);

  /* Clone the user portion buffer, which can be zero length */
  ubuf = Curl_memdup0(login, ulen);
  if(!ubuf)
    goto error;

  /* Clone the password portion buffer */
  if(psep) {
    pbuf = Curl_memdup0(&psep[1], plen);
    if(!pbuf)
      goto error;
  }

  /* Allocate the options portion buffer */
  if(optionsp) {
    char *obuf = NULL;
    if(olen) {
      obuf = Curl_memdup0(&osep[1], olen);
      if(!obuf)
        goto error;
    }
    *optionsp = obuf;
  }
  *userp = ubuf;
  *passwdp = pbuf;
  return CURLE_OK;
error:
  free(ubuf);
  free(pbuf);
  return CURLE_OUT_OF_MEMORY;
}